

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_default_xml_generator.hpp
# Opt level: O0

void __thiscall
iutest::DefaultXmlGeneratorListener::~DefaultXmlGeneratorListener(DefaultXmlGeneratorListener *this)

{
  TestEventListeners *this_00;
  DefaultXmlGeneratorListener *this_local;
  
  (this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener =
       (_func_int **)&PTR__DefaultXmlGeneratorListener_00196230;
  (*(this->super_EmptyTestEventListener).super_TestEventListener._vptr_TestEventListener[0x15])();
  this_00 = TestEnv::event_listeners();
  TestEventListeners::set_default_xml_generator(this_00,(TestEventListener *)0x0);
  std::__cxx11::string::~string((string *)&this->m_output_path);
  std::__cxx11::string::~string((string *)&this->m_output_path_format);
  EmptyTestEventListener::~EmptyTestEventListener(&this->super_EmptyTestEventListener);
  return;
}

Assistant:

virtual ~DefaultXmlGeneratorListener()
    {
        FileClose();
        TestEnv::event_listeners().set_default_xml_generator(NULL);
    }